

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O3

void __thiscall
TPZManVector<double,_4>::Resize(TPZManVector<double,_4> *this,int64_t newsize,double *object)

{
  double *pdVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  double *pdVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  int64_t i;
  double dVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  
  auVar3 = _DAT_014d28c0;
  auVar2 = _DAT_014d28b0;
  if (newsize < 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"TManVec::Resize. Bad parameter newsize.",0x27);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + ' ');
    std::ostream::put(' ');
    std::ostream::flush();
    std::ostream::flush();
    return;
  }
  lVar6 = (this->super_TPZVec<double>).fNElements;
  if (newsize != lVar6) {
    lVar5 = (this->super_TPZVec<double>).fNAlloc;
    if (lVar5 < newsize) {
      if ((ulong)newsize < 5) {
        if (lVar6 < 1) {
          lVar6 = 0;
        }
        else {
          pdVar4 = (this->super_TPZVec<double>).fStore;
          lVar5 = 0;
          do {
            this->fExtAlloc[lVar5] = pdVar4[lVar5];
            lVar5 = lVar5 + 1;
          } while (lVar6 != lVar5);
        }
        auVar3 = _DAT_014d28c0;
        auVar2 = _DAT_014d28b0;
        lVar5 = newsize - lVar6;
        if (lVar5 != 0 && lVar6 <= newsize) {
          dVar10 = *object;
          lVar7 = lVar5 + -1;
          auVar12._8_4_ = (int)lVar7;
          auVar12._0_8_ = lVar7;
          auVar12._12_4_ = (int)((ulong)lVar7 >> 0x20);
          uVar9 = 0;
          auVar12 = auVar12 ^ _DAT_014d28c0;
          do {
            auVar15._8_4_ = (int)uVar9;
            auVar15._0_8_ = uVar9;
            auVar15._12_4_ = (int)(uVar9 >> 0x20);
            auVar16 = (auVar15 | auVar2) ^ auVar3;
            if ((bool)(~(auVar16._4_4_ == auVar12._4_4_ && auVar12._0_4_ < auVar16._0_4_ ||
                        auVar12._4_4_ < auVar16._4_4_) & 1)) {
              this->fExtAlloc[lVar6 + uVar9] = dVar10;
            }
            if ((auVar16._12_4_ != auVar12._12_4_ || auVar16._8_4_ <= auVar12._8_4_) &&
                auVar16._12_4_ <= auVar12._12_4_) {
              this->fExtAlloc[lVar6 + uVar9 + 1] = dVar10;
            }
            uVar9 = uVar9 + 2;
          } while ((lVar5 + 1U & 0xfffffffffffffffe) != uVar9);
        }
        pdVar4 = (this->super_TPZVec<double>).fStore;
        if (pdVar4 != (double *)0x0 && pdVar4 != this->fExtAlloc) {
          operator_delete__(pdVar4);
        }
        (this->super_TPZVec<double>).fStore = this->fExtAlloc;
        (this->super_TPZVec<double>).fNElements = newsize;
        (this->super_TPZVec<double>).fNAlloc = 4;
      }
      else {
        dVar10 = (double)lVar5 * 1.2;
        uVar9 = (long)dVar10;
        if (dVar10 < (double)newsize) {
          uVar9 = newsize;
        }
        pdVar4 = (double *)operator_new__(-(ulong)(uVar9 >> 0x3d != 0) | uVar9 * 8);
        lVar5 = 0;
        if (0 < lVar6) {
          pdVar1 = (this->super_TPZVec<double>).fStore;
          lVar7 = 0;
          do {
            pdVar4[lVar7] = pdVar1[lVar7];
            lVar7 = lVar7 + 1;
            lVar5 = lVar6;
          } while (lVar6 != lVar7);
        }
        auVar3 = _DAT_014d28c0;
        auVar2 = _DAT_014d28b0;
        lVar6 = newsize - lVar5;
        if (lVar6 != 0 && lVar5 <= newsize) {
          dVar10 = *object;
          lVar7 = lVar6 + -1;
          auVar11._8_4_ = (int)lVar7;
          auVar11._0_8_ = lVar7;
          auVar11._12_4_ = (int)((ulong)lVar7 >> 0x20);
          uVar8 = 0;
          auVar11 = auVar11 ^ _DAT_014d28c0;
          do {
            auVar14._8_4_ = (int)uVar8;
            auVar14._0_8_ = uVar8;
            auVar14._12_4_ = (int)(uVar8 >> 0x20);
            auVar16 = (auVar14 | auVar2) ^ auVar3;
            if ((bool)(~(auVar16._4_4_ == auVar11._4_4_ && auVar11._0_4_ < auVar16._0_4_ ||
                        auVar11._4_4_ < auVar16._4_4_) & 1)) {
              pdVar4[lVar5 + uVar8] = dVar10;
            }
            if ((auVar16._12_4_ != auVar11._12_4_ || auVar16._8_4_ <= auVar11._8_4_) &&
                auVar16._12_4_ <= auVar11._12_4_) {
              pdVar4[lVar5 + uVar8 + 1] = dVar10;
            }
            uVar8 = uVar8 + 2;
          } while ((lVar6 + 1U & 0xfffffffffffffffe) != uVar8);
        }
        pdVar1 = (this->super_TPZVec<double>).fStore;
        if (pdVar1 != (double *)0x0 && pdVar1 != this->fExtAlloc) {
          operator_delete__(pdVar1);
        }
        (this->super_TPZVec<double>).fStore = pdVar4;
        (this->super_TPZVec<double>).fNElements = newsize;
        (this->super_TPZVec<double>).fNAlloc = uVar9;
      }
    }
    else {
      lVar5 = newsize - lVar6;
      if (lVar5 != 0 && lVar6 <= newsize) {
        pdVar4 = (this->super_TPZVec<double>).fStore;
        dVar10 = *object;
        lVar7 = lVar5 + -1;
        auVar16._8_4_ = (int)lVar7;
        auVar16._0_8_ = lVar7;
        auVar16._12_4_ = (int)((ulong)lVar7 >> 0x20);
        uVar9 = 0;
        auVar16 = auVar16 ^ _DAT_014d28c0;
        do {
          auVar13._8_4_ = (int)uVar9;
          auVar13._0_8_ = uVar9;
          auVar13._12_4_ = (int)(uVar9 >> 0x20);
          auVar13 = (auVar13 | auVar2) ^ auVar3;
          if ((bool)(~(auVar13._4_4_ == auVar16._4_4_ && auVar16._0_4_ < auVar13._0_4_ ||
                      auVar16._4_4_ < auVar13._4_4_) & 1)) {
            pdVar4[lVar6 + uVar9] = dVar10;
          }
          if ((auVar13._12_4_ != auVar16._12_4_ || auVar13._8_4_ <= auVar16._8_4_) &&
              auVar13._12_4_ <= auVar16._12_4_) {
            pdVar4[lVar6 + uVar9 + 1] = dVar10;
          }
          uVar9 = uVar9 + 2;
        } while ((lVar5 + 1U & 0xfffffffffffffffe) != uVar9);
      }
      (this->super_TPZVec<double>).fNElements = newsize;
    }
  }
  return;
}

Assistant:

void TPZManVector< T, NumExtAlloc >::Resize(const int64_t newsize, const T& object) {
#ifndef PZNODEBUG
    if (newsize < 0) {
        PZError << "TManVec::Resize. Bad parameter newsize." << std::endl;
        PZError.flush();
        return;
    }
    if (newsize == this->fNElements)
        return;
#endif

    if (newsize <= this->fNAlloc) {
        for (int64_t i = this->fNElements; i < newsize; i++)
            this->fStore[i] = object;

        this->fNElements = newsize;
    } else if (newsize <= NumExtAlloc) { // that is, fExtAlloc != this->fStore. Moreover : this->fNElements <= this->fNAlloc
        // <= NumExtAlloc

        int64_t i;

        for (i = 0L; i < this->fNElements; i++) {
            fExtAlloc[i] = this->fStore[i];
        }

        for (; i < newsize; i++)
            fExtAlloc[i] = object;

        if (this->fStore != fExtAlloc) delete [] this->fStore;

        this->fStore = fExtAlloc;
        this->fNElements = newsize;
        this->fNAlloc = NumExtAlloc;
    } else { // the size is larger than the allocated memory, then this->fNElements
        // is always lower than newsize because fNElemets <=this->fNAllocs
        int64_t i, realsize = ExpandSize(newsize);

        T* newstore = new T[realsize];

        for (i = 0L; i < this->fNElements; i++) {
            newstore[i] = this->fStore[i];
        }

        for (; i < newsize; i++)
            newstore[i] = object;

        if (this->fStore != fExtAlloc)
            delete[]this->fStore;

        this->fStore = newstore;
        this->fNElements = newsize;
        this->fNAlloc = realsize;
    }
}